

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall mkvparser::Tracks::Parse(Tracks *this)

{
  IMkvReader *pReader;
  long lVar1;
  Track **ppTVar2;
  long lVar3;
  long lVar4;
  longlong element_start;
  Tracks *this_00;
  ulong uVar5;
  bool bVar6;
  longlong pos;
  longlong size;
  longlong id;
  long local_50;
  long local_48;
  long local_40;
  Tracks *local_38;
  
  local_50 = this->m_start;
  lVar4 = this->m_size;
  pReader = this->m_pSegment->m_pReader;
  bVar6 = lVar4 == 0;
  if (0 < lVar4) {
    lVar4 = lVar4 + local_50;
    uVar5 = 0;
    local_38 = this;
    do {
      lVar1 = ParseElementHeader(pReader,&local_50,lVar4,&local_40,&local_48);
      if (lVar1 < 0) {
        return lVar1;
      }
      if (local_48 != 0) {
        if (local_40 == 0xae) {
          if (0x7ffffffe < (long)uVar5) {
            return -1;
          }
          uVar5 = uVar5 + 1;
        }
        local_50 = local_48 + local_50;
        if (lVar4 < local_50) {
          return -2;
        }
      }
    } while (local_50 < lVar4);
    if (local_50 != lVar4) {
      return -2;
    }
    if ((long)uVar5 < 1) {
      return 0;
    }
    ppTVar2 = (Track **)
              operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 << 3,(nothrow_t *)&std::nothrow);
    local_38->m_trackEntries = ppTVar2;
    if (ppTVar2 == (Track **)0x0) {
      return -1;
    }
    local_38->m_trackEntriesEnd = ppTVar2;
    local_50 = local_38->m_start;
    if (local_50 < lVar4) {
      this_00 = local_38;
      do {
        lVar1 = local_50;
        lVar3 = ParseElementHeader(pReader,&local_50,lVar4,&local_40,&local_48);
        if (lVar3 < 0) {
          return lVar3;
        }
        if (local_48 != 0) {
          lVar3 = local_50 + local_48;
          if (local_40 == 0xae) {
            ppTVar2 = this_00->m_trackEntriesEnd;
            *ppTVar2 = (Track *)0x0;
            lVar1 = ParseTrackEntry(this_00,local_50,local_48,lVar1,lVar3 - lVar1,ppTVar2);
            if (lVar1 != 0) {
              return lVar1;
            }
            this_00 = local_38;
            if (*ppTVar2 != (Track *)0x0) {
              local_38->m_trackEntriesEnd = local_38->m_trackEntriesEnd + 1;
            }
          }
          local_50 = lVar3;
          if (lVar4 < lVar3) {
            return -2;
          }
        }
      } while (local_50 < lVar4);
    }
    bVar6 = local_50 == lVar4;
  }
  return (ulong)bVar6 * 2 + -2;
}

Assistant:

long Tracks::Parse() {
  assert(m_trackEntries == NULL);
  assert(m_trackEntriesEnd == NULL);

  const long long stop = m_start + m_size;
  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long count = 0;
  long long pos = m_start;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)  // weird
      continue;

    if (id == libwebm::kMkvTrackEntry) {
      ++count;
      if (count > INT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  if (count <= 0)
    return 0;  // success

  m_trackEntries = new (std::nothrow) Track*[static_cast<size_t>(count)];

  if (m_trackEntries == NULL)
    return -1;

  m_trackEntriesEnd = m_trackEntries;

  pos = m_start;

  while (pos < stop) {
    const long long element_start = pos;

    long long id, payload_size;

    const long status =
        ParseElementHeader(pReader, pos, stop, id, payload_size);

    if (status < 0)  // error
      return status;

    if (payload_size == 0)  // weird
      continue;

    const long long payload_stop = pos + payload_size;
    assert(payload_stop <= stop);  // checked in ParseElement

    const long long element_size = payload_stop - element_start;

    if (id == libwebm::kMkvTrackEntry) {
      Track*& pTrack = *m_trackEntriesEnd;
      pTrack = NULL;

      const long status = ParseTrackEntry(pos, payload_size, element_start,
                                          element_size, pTrack);
      if (status)
        return status;

      if (pTrack)
        ++m_trackEntriesEnd;
    }

    pos = payload_stop;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  return 0;  // success
}